

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::php::anon_unknown_2::GenerateEnumFile
          (anon_unknown_2 *this,FileDescriptor *file,EnumDescriptor *en,Options *options,
          GeneratorContext *generator_context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  long lVar3;
  Options *options_00;
  bool bVar4;
  ZeroCopyOutputStream *pZVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  ZeroCopyOutputStream *pZVar9;
  long *plVar10;
  int indentCount;
  long lVar11;
  string filename_1;
  Printer printer_1;
  string php_namespace;
  Printer printer;
  string filename;
  string fullname;
  string newname;
  string local_260;
  undefined1 local_240 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  _Alloc_hider local_210;
  undefined1 local_208 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0 [3];
  undefined1 local_1a0 [32];
  Printer local_180;
  string local_e0;
  ZeroCopyOutputStream *local_c0;
  Options *local_b8;
  FileDescriptor *local_b0;
  string local_a8;
  string local_88;
  anon_unknown_2 *local_68;
  Options *local_60;
  long local_58;
  string local_50;
  
  local_b8 = options;
  FullClassName<google::protobuf::EnumDescriptor>
            ((string *)local_240,(EnumDescriptor *)file,(Options *)en);
  if ((ZeroCopyOutputStream *)local_240._8_8_ == (ZeroCopyOutputStream *)0x0) {
    pZVar9 = (ZeroCopyOutputStream *)0x0;
  }
  else {
    pZVar5 = (ZeroCopyOutputStream *)0x0;
    do {
      if (*(char *)(local_240._0_8_ + (long)pZVar5) == '\\') {
        *(char *)(local_240._0_8_ + (long)pZVar5) = '/';
      }
      pZVar5 = (ZeroCopyOutputStream *)((long)&pZVar5->_vptr_ZeroCopyOutputStream + 1);
      pZVar9 = (ZeroCopyOutputStream *)local_240._8_8_;
    } while (pZVar5 < (ulong)local_240._8_8_);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,local_240._0_8_,
             (pointer)(local_240._0_8_ + (long)&pZVar9->_vptr_ZeroCopyOutputStream));
  std::__cxx11::string::append((char *)&local_e0);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_);
  }
  local_c0 = (ZeroCopyOutputStream *)(**(code **)(*(long *)local_b8 + 0x10))(local_b8,&local_e0);
  io::Printer::Printer(&local_180,local_c0,'^');
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_180,
             "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this);
  local_68 = this;
  FilenameToClassname(&local_88,&local_e0);
  lVar6 = std::__cxx11::string::find_last_of((char *)&local_88,0x3d9bdf,0xffffffffffffffff);
  if (lVar6 << 0x20 != -0x100000000) {
    std::__cxx11::string::substr((ulong)local_240,(ulong)&local_88);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&local_180,"namespace ^name^;\n\n",(char (*) [5])0x3ea8a1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
    if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
      operator_delete((void *)local_240._0_8_);
    }
    io::Printer::Print<>(&local_180,"use UnexpectedValueException;\n\n");
  }
  io::Printer::Print<>(&local_180,"/**\n");
  local_240._16_8_ = &local_220;
  local_240._24_8_ = 0;
  local_220._M_local_buf[0] = '\0';
  local_210._M_p = local_208 + 8;
  local_208._0_8_ = 0;
  local_208[8] = '\0';
  local_1f0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f0[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = EnumDescriptor::GetSourceLocation((EnumDescriptor *)file,(SourceLocation *)local_240);
  if (bVar4) {
    GenerateDocCommentBodyForLocation
              ((anon_unknown_2 *)&local_180,(Printer *)local_240,(SourceLocation *)0x1,false,
               (int)generator_context);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1f0);
  if (local_210._M_p != local_208 + 8) {
    operator_delete(local_210._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._16_8_ != &local_220) {
    operator_delete((void *)local_240._16_8_);
  }
  EscapePhpdoc((string *)local_240,(string *)(*(long *)(file + 8) + 0x20));
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_180," * Protobuf type <code>^fullname^</code>\n */\n",(char (*) [9])"fullname",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
  if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
    operator_delete((void *)local_240._0_8_);
  }
  if (lVar6 << 0x20 != -0x100000000) {
    std::__cxx11::string::substr((ulong)local_240,(ulong)&local_88);
    std::__cxx11::string::operator=((string *)&local_88,(string *)local_240);
    if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
      operator_delete((void *)local_240._0_8_);
    }
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (&local_180,"class ^name^\n{\n",(char (*) [5])0x3ea8a1,&local_88);
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  local_b0 = file;
  local_60 = (Options *)en;
  if (0 < *(int *)(file + 4)) {
    lVar11 = 0;
    lVar6 = 0;
    do {
      indentCount = (int)generator_context;
      lVar3 = *(long *)(file + 0x28);
      local_58 = lVar6;
      io::Printer::Print<>(&local_180,"/**\n");
      local_240._16_8_ = &local_220;
      local_240._24_8_ = 0;
      local_220._M_local_buf[0] = '\0';
      local_210._M_p = local_208 + 8;
      local_208._0_8_ = 0;
      local_208[8] = '\0';
      local_1f0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1f0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar4 = EnumValueDescriptor::GetSourceLocation
                        ((EnumValueDescriptor *)(lVar3 + lVar11),(SourceLocation *)local_240);
      if (bVar4) {
        GenerateDocCommentBodyForLocation
                  ((anon_unknown_2 *)&local_180,(Printer *)local_240,(SourceLocation *)0x1,false,
                   indentCount);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(local_1f0);
      if (local_210._M_p != local_208 + 8) {
        operator_delete(local_210._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._16_8_ != &local_220) {
        operator_delete((void *)local_240._16_8_);
      }
      EnumValueDescriptor::DebugString_abi_cxx11_
                ((string *)local_1a0,(EnumValueDescriptor *)(lVar3 + lVar11));
      FirstLineOf(&local_260,(anon_unknown_2 *)local_1a0._0_8_,(string *)local_1a0._8_8_);
      EscapePhpdoc((string *)local_240,&local_260);
      io::Printer::Print<char[4],std::__cxx11::string>
                (&local_180," * Generated from protobuf enum <code>^def^</code>\n */\n",
                 (char (*) [4])0x3e0b21,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if ((anon_unknown_2 *)local_1a0._0_8_ != (anon_unknown_2 *)(local_1a0 + 0x10)) {
        operator_delete((void *)local_1a0._0_8_);
      }
      puVar8 = *(undefined8 **)(lVar3 + 8 + lVar11);
      ConstantNamePrefix(&local_260,(anon_unknown_2 *)*puVar8,(string *)puVar8[1]);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_260,**(ulong **)(lVar3 + 8 + lVar11));
      local_240._0_8_ = local_240 + 0x10;
      plVar10 = plVar7 + 2;
      if ((long *)*plVar7 == plVar10) {
        local_240._16_8_ = *plVar10;
        local_240._24_8_ = plVar7[3];
      }
      else {
        local_240._16_8_ = *plVar10;
        local_240._0_8_ = (long *)*plVar7;
      }
      local_240._8_8_ = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      (anonymous_namespace)::IntToString_abi_cxx11_
                ((string *)local_1a0,(_anonymous_namespace_ *)(ulong)*(uint *)(lVar3 + 4 + lVar11),
                 (int32)local_240._8_8_);
      generator_context = (GeneratorContext *)0x3ff2bd;
      io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
                (&local_180,"const ^name^ = ^number^;\n",(char (*) [5])0x3ea8a1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 (char (*) [7])0x3ff2bd,(string *)local_1a0);
      file = local_b0;
      if ((anon_unknown_2 *)local_1a0._0_8_ != (anon_unknown_2 *)(local_1a0 + 0x10)) {
        operator_delete((void *)local_1a0._0_8_);
      }
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_);
      }
      lVar6 = local_58;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      lVar6 = lVar6 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar6 < *(int *)(file + 4));
  }
  io::Printer::Print<>(&local_180,"\nprivate static $valueToName = [\n");
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  if (0 < *(int *)(file + 4)) {
    lVar11 = 8;
    lVar6 = 0;
    do {
      lVar3 = *(long *)(file + 0x28);
      puVar8 = *(undefined8 **)(lVar3 + lVar11);
      ConstantNamePrefix(&local_260,(anon_unknown_2 *)*puVar8,(string *)puVar8[1]);
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_260,**(ulong **)(lVar3 + lVar11));
      file = local_b0;
      local_240._0_8_ = local_240 + 0x10;
      plVar7 = puVar8 + 2;
      if ((long *)*puVar8 == plVar7) {
        local_240._16_8_ = *plVar7;
        local_240._24_8_ = puVar8[3];
      }
      else {
        local_240._16_8_ = *plVar7;
        local_240._0_8_ = (long *)*puVar8;
      }
      local_240._8_8_ = puVar8[1];
      *puVar8 = plVar7;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      io::Printer::Print<char[5],std::__cxx11::string>
                (&local_180,"self::^name^ => \'^name^\',\n",(char (*) [5])0x3ea8a1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
      if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
        operator_delete((void *)local_240._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      lVar6 = lVar6 + 1;
      lVar11 = lVar11 + 0x20;
    } while (lVar6 < *(int *)(file + 4));
  }
  io::Printer::Outdent(&local_180);
  options_00 = local_60;
  io::Printer::Outdent(&local_180);
  io::Printer::Print<>(&local_180,"];\n");
  io::Printer::Print<>(&local_180,"\npublic static function name($value)\n{\n");
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Print<>(&local_180,"if (!isset(self::$valueToName[$value])) {\n");
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Print<>(&local_180,"throw new UnexpectedValueException(sprintf(\n");
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Print<>
            (&local_180,"\'Enum %s has no name defined for value %s\', __CLASS__, $value));\n");
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Print<>(&local_180,"}\nreturn self::$valueToName[$value];\n");
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Print<>(&local_180,"}\n\n");
  io::Printer::Print<>(&local_180,"\npublic static function value($name)\n{\n");
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Print<>
            (&local_180,
             "$const = __CLASS__ . \'::\' . strtoupper($name);\nif (!defined($const)) {\n");
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Print<>(&local_180,"throw new UnexpectedValueException(sprintf(\n");
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Indent(&local_180);
  io::Printer::Print<>
            (&local_180,"\'Enum %s has no value defined for name %s\', __CLASS__, $name));\n");
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Print<>(&local_180,"}\nreturn constant($const);\n");
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Print<>(&local_180,"}\n");
  io::Printer::Outdent(&local_180);
  io::Printer::Outdent(&local_180);
  io::Printer::Print<>(&local_180,"}\n\n");
  if (*(long *)((EnumDescriptor *)file + 0x18) != 0) {
    io::Printer::Print<>
              (&local_180,
               "// Adding a class alias for backwards compatibility with the previous class name.\n"
              );
    LegacyFullClassName<google::protobuf::EnumDescriptor>
              ((string *)local_240,(EnumDescriptor *)file,options_00);
    io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
              (&local_180,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
               &local_88,(char (*) [4])"old",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240);
    if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
      operator_delete((void *)local_240._0_8_);
    }
    LegacyFullClassName<google::protobuf::EnumDescriptor>
              ((string *)local_240,(EnumDescriptor *)file,options_00);
    if ((ZeroCopyOutputStream *)local_240._8_8_ == (ZeroCopyOutputStream *)0x0) {
      pZVar9 = (ZeroCopyOutputStream *)0x0;
    }
    else {
      pZVar5 = (ZeroCopyOutputStream *)0x0;
      do {
        if (*(char *)(local_240._0_8_ + (long)pZVar5) == '\\') {
          *(char *)(local_240._0_8_ + (long)pZVar5) = '/';
        }
        pZVar5 = (ZeroCopyOutputStream *)((long)&pZVar5->_vptr_ZeroCopyOutputStream + 1);
        pZVar9 = (ZeroCopyOutputStream *)local_240._8_8_;
      } while (pZVar5 < (ulong)local_240._8_8_);
    }
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,local_240._0_8_,
               (pointer)(local_240._0_8_ + (long)&pZVar9->_vptr_ZeroCopyOutputStream));
    std::__cxx11::string::append((char *)&local_260);
    if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
      operator_delete((void *)local_240._0_8_);
    }
    pZVar9 = (ZeroCopyOutputStream *)(**(code **)(*(long *)local_b8 + 0x10))(local_b8,&local_260);
    io::Printer::Printer((Printer *)local_240,pZVar9,'^');
    io::Printer::Print<char[9],std::__cxx11::string>
              ((Printer *)local_240,
               "<?php\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: ^filename^\n\n"
               ,(char (*) [9])"filename",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)local_68);
    uVar2._0_1_ = options_00->is_descriptor;
    uVar2._1_1_ = options_00->aggregate_metadata;
    uVar2._2_1_ = options_00->gen_c_wkt;
    uVar2._3_1_ = options_00->field_0x3;
    RootPhpNamespace<google::protobuf::EnumDescriptor>
              ((string *)local_1a0,*(EnumDescriptor **)((EnumDescriptor *)file + 0x10),
               (Options *)(ulong)uVar2);
    if ((string *)local_1a0._8_8_ != (string *)0x0) {
      io::Printer::Print<char[5],std::__cxx11::string>
                ((Printer *)local_240,"namespace ^name^;\n\n",(char (*) [5])0x3ea8a1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0);
    }
    FullClassName<google::protobuf::EnumDescriptor>(&local_50,(EnumDescriptor *)file,options_00);
    io::Printer::Print<>((Printer *)local_240,"if (false) {\n");
    io::Printer::Indent((Printer *)local_240);
    io::Printer::Indent((Printer *)local_240);
    io::Printer::Print<>((Printer *)local_240,"/**\n");
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)local_240," * This class is deprecated. Use ^new^ instead.\n",
               (char (*) [4])"new",&local_50);
    io::Printer::Print<>((Printer *)local_240," * @deprecated\n");
    io::Printer::Print<>((Printer *)local_240," */\n");
    LegacyGeneratedClassName<google::protobuf::EnumDescriptor>(&local_a8,(EnumDescriptor *)file);
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)local_240,"class ^old^ {}\n",(char (*) [4])"old",&local_a8);
    paVar1 = &local_a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    io::Printer::Outdent((Printer *)local_240);
    io::Printer::Outdent((Printer *)local_240);
    io::Printer::Print<>((Printer *)local_240,"}\n");
    GeneratedClassNameImpl<google::protobuf::EnumDescriptor>(&local_a8,(EnumDescriptor *)file);
    io::Printer::Print<char[4],std::__cxx11::string>
              ((Printer *)local_240,"class_exists(^new^::class);\n",(char (*) [4])"new",&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    LegacyFullClassName<google::protobuf::EnumDescriptor>
              (&local_a8,(EnumDescriptor *)file,options_00);
    io::Printer::Print<char[4],std::__cxx11::string,char[9],std::__cxx11::string>
              ((Printer *)local_240,
               "@trigger_error(\'^old^ is deprecated and will be removed in the next major release. Use ^fullname^ instead\', E_USER_DEPRECATED);\n\n"
               ,(char (*) [4])"old",&local_a8,(char (*) [9])"fullname",&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_unknown_2 *)local_1a0._0_8_ != (anon_unknown_2 *)(local_1a0 + 0x10)) {
      operator_delete((void *)local_1a0._0_8_);
    }
    io::Printer::~Printer((Printer *)local_240);
    if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  io::Printer::~Printer(&local_180);
  if (local_c0 != (ZeroCopyOutputStream *)0x0) {
    (*local_c0->_vptr_ZeroCopyOutputStream[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      const Options& options,
                      GeneratorContext* generator_context) {
  std::string filename = GeneratedClassFileName(en, options);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != std::string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    // We only need this 'use' statement if the enum has a namespace.
    // Otherwise, we get a warning that the use statement has no effect.
    printer.Print("use UnexpectedValueException;\n\n");
  }

  GenerateEnumDocComment(&printer, en, options);

  if (lastindex != std::string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ConstantNamePrefix(value->name()) + value->name(),
                  "number", IntToString(value->number()));
  }

  printer.Print("\nprivate static $valueToName = [\n");
  Indent(&printer);
  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer.Print("self::^name^ => '^name^',\n",
                  "name", ConstantNamePrefix(value->name()) + value->name());
  }
  Outdent(&printer);
  printer.Print("];\n");

  printer.Print(
      "\npublic static function name($value)\n"
      "{\n");
  Indent(&printer);
  printer.Print("if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no name defined for value %s', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return self::$valueToName[$value];\n");
  Outdent(&printer);
  printer.Print("}\n\n");

  printer.Print(
      "\npublic static function value($name)\n"
      "{\n");
  Indent(&printer);
  printer.Print("$const = __CLASS__ . '::' . strtoupper($name);\n"
                "if (!defined($const)) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no value defined for name %s', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return constant($const);\n");
  Outdent(&printer);
  printer.Print("}\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatibility with nested messages and enums
  if (en->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(en, options));
    LegacyGenerateClassFile(file, en, options, generator_context);
  }
}